

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O1

void __thiscall
OSTEI_HRR_Writer::WriteBraSteps_
          (OSTEI_HRR_Writer *this,ostream *os,HRRDoubletStepList *steps,string *tag,
          string *ncart_ket,string *ketstr)

{
  pointer pcVar1;
  ostream *poVar2;
  pointer pHVar3;
  OSTEI_HRR_Writer *pOVar4;
  char *pcVar5;
  Doublet src1;
  Doublet src0;
  Doublet target;
  undefined1 local_120 [32];
  pointer local_100;
  undefined1 local_f8 [32];
  _Alloc_hider local_d8;
  char local_c8 [16];
  undefined1 local_b8 [32];
  _Alloc_hider local_98;
  char local_88 [16];
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  char local_48 [24];
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent4_abi_cxx11_._M_dataplus._M_p,indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"for(iket = 0; iket < ",0x15);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(ncart_ket->_M_dataplus)._M_p,ncart_ket->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; ++iket)\n",10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent4_abi_cxx11_._M_dataplus._M_p,indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  pHVar3 = (steps->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_100 = (steps->super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (pHVar3 != local_100) {
    do {
      local_78._0_4_ = (pHVar3->target).type;
      local_78._4_4_ = (pHVar3->target).left.ijk._M_elems[0];
      local_78._8_4_ = (pHVar3->target).left.ijk._M_elems[1];
      local_78._12_4_ = (pHVar3->target).left.ijk._M_elems[2];
      local_78._16_4_ = (pHVar3->target).right.ijk._M_elems[0];
      local_78._20_4_ = (pHVar3->target).right.ijk._M_elems[1];
      local_78._24_4_ = (pHVar3->target).right.ijk._M_elems[2];
      local_58._M_p = local_48;
      pcVar1 = (pHVar3->target).tag._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar1,pcVar1 + (pHVar3->target).tag._M_string_length);
      local_b8._0_4_ = (pHVar3->src)._M_elems[0].type;
      local_b8._4_4_ = (pHVar3->src)._M_elems[0].left.ijk._M_elems[0];
      local_b8._8_4_ = *(int *)((long)(pHVar3->src)._M_elems[0].left.ijk._M_elems + 4);
      local_b8._12_4_ = *(int *)((long)(pHVar3->src)._M_elems[0].left.ijk._M_elems + 8);
      local_b8._16_4_ = (pHVar3->src)._M_elems[0].right.ijk._M_elems[0];
      local_b8._20_4_ = *(int *)((long)(pHVar3->src)._M_elems[0].right.ijk._M_elems + 4);
      local_b8._24_4_ = *(int *)((long)(pHVar3->src)._M_elems[0].right.ijk._M_elems + 8);
      local_98._M_p = local_88;
      pcVar1 = (pHVar3->src)._M_elems[0].tag._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar1,pcVar1 + (pHVar3->src)._M_elems[0].tag._M_string_length)
      ;
      local_f8._0_4_ = (pHVar3->src)._M_elems[1].type;
      local_f8._4_4_ = (pHVar3->src)._M_elems[1].left.ijk._M_elems[0];
      local_f8._8_4_ = *(int *)((long)(pHVar3->src)._M_elems[1].left.ijk._M_elems + 4);
      local_f8._12_4_ = *(int *)((long)(pHVar3->src)._M_elems[1].left.ijk._M_elems + 8);
      local_f8._16_4_ = (pHVar3->src)._M_elems[1].right.ijk._M_elems[0];
      local_f8._20_4_ = *(int *)((long)(pHVar3->src)._M_elems[1].right.ijk._M_elems + 4);
      local_f8._24_4_ = *(int *)((long)(pHVar3->src)._M_elems[1].right.ijk._M_elems + 8);
      local_d8._M_p = local_c8;
      pcVar1 = (pHVar3->src)._M_elems[1].tag._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar1,pcVar1 + (pHVar3->src)._M_elems[1].tag._M_string_length)
      ;
      std::__cxx11::string::_M_assign((string *)&local_58);
      std::__cxx11::string::_M_assign((string *)&local_98);
      std::__cxx11::string::_M_assign((string *)&local_d8);
      pcVar5 = " + ";
      if (pHVar3->type == I) {
        pcVar5 = " - ";
      }
      local_120._0_8_ = local_120 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_120,'\x14');
      pOVar4 = (OSTEI_HRR_Writer *)local_120._0_8_;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_120._0_8_,local_120._8_8_)
      ;
      if ((OSTEI_HRR_Writer *)local_120._0_8_ != (OSTEI_HRR_Writer *)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_);
      }
      HRRBraStepVar_((string *)local_120,pOVar4,(Doublet *)local_78,ncart_ket,ketstr);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_120._0_8_,local_120._8_8_)
      ;
      if ((OSTEI_HRR_Writer *)local_120._0_8_ != (OSTEI_HRR_Writer *)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_);
      }
      pOVar4 = (OSTEI_HRR_Writer *)0x149be8;
      std::__ostream_insert<char,std::char_traits<char>>(os," = ",3);
      HRRBraStepVar_((string *)local_120,pOVar4,(Doublet *)local_b8,ncart_ket,ketstr);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_120._0_8_,local_120._8_8_)
      ;
      if ((OSTEI_HRR_Writer *)local_120._0_8_ != (OSTEI_HRR_Writer *)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,3);
      std::__ostream_insert<char,std::char_traits<char>>(os,"( hAB[",6);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,pHVar3->xyz);
      pOVar4 = (OSTEI_HRR_Writer *)0x14b9a1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] * ",4);
      HRRBraStepVar_((string *)local_120,pOVar4,(Doublet *)local_f8,ncart_ket,ketstr);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_120._0_8_,local_120._8_8_)
      ;
      if ((OSTEI_HRR_Writer *)local_120._0_8_ != (OSTEI_HRR_Writer *)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os," );",3);
      std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
      if (local_d8._M_p != local_c8) {
        operator_delete(local_d8._M_p);
      }
      if (local_98._M_p != local_88) {
        operator_delete(local_98._M_p);
      }
      if (local_58._M_p != local_48) {
        operator_delete(local_58._M_p);
      }
      pHVar3 = pHVar3 + 1;
    } while (pHVar3 != local_100);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent4_abi_cxx11_._M_dataplus._M_p,indent4_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteBraSteps_(std::ostream & os, const HRRDoubletStepList & steps,
                                      const std::string & tag,
                                      const std::string & ncart_ket, const std::string & ketstr) const
{
    os << indent4 << "for(iket = 0; iket < " << ncart_ket << "; ++iket)\n";
    os << indent4 << "{\n";

    for(const auto & it : steps)
    {
        //os << std::string(20, ' ') << "// " << it << "\n";

        // add the appropriate integral tags
        Doublet target(it.target);
        Doublet src0(it.src[0]);
        Doublet src1(it.src[1]);
        target.tag = tag;
        src0.tag = tag;
        src1.tag = tag;
    
        const char * sign = " + ";
        if(it.type == RRStepType::I) // moving from J->I
            sign = " - ";

        os << std::string(20, ' ');

        os << HRRBraStepVar_(target, ncart_ket, ketstr);

        os << " = ";
        os << HRRBraStepVar_(src0, ncart_ket, ketstr);
        os << sign << "( hAB[" << static_cast<int>(it.xyz) << "] * ";
        os << HRRBraStepVar_(src1, ncart_ket, ketstr);
        os << " );";
        os << "\n\n";
    }

    os << indent4 << "}\n";
    os << "\n";
}